

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  int iVar1;
  ImGuiColorMod *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  ImGuiColorMod *__dest;
  ImVec4 *pIVar8;
  int iVar9;
  int iVar10;
  
  pIVar7 = GImGui;
  pIVar8 = (GImGui->Style).Colors + idx;
  fVar3 = pIVar8->x;
  fVar4 = pIVar8->y;
  fVar5 = pIVar8->z;
  fVar6 = pIVar8->w;
  iVar10 = (GImGui->ColorStack).Size;
  iVar1 = (GImGui->ColorStack).Capacity;
  if (iVar10 == iVar1) {
    iVar10 = iVar10 + 1;
    if (iVar1 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar1 / 2 + iVar1;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar1 < iVar10) {
      __dest = (ImGuiColorMod *)MemAlloc((long)iVar10 * 0x14);
      pIVar2 = (pIVar7->ColorStack).Data;
      if (pIVar2 != (ImGuiColorMod *)0x0) {
        memcpy(__dest,pIVar2,(long)(pIVar7->ColorStack).Size * 0x14);
        MemFree((pIVar7->ColorStack).Data);
      }
      (pIVar7->ColorStack).Data = __dest;
      (pIVar7->ColorStack).Capacity = iVar10;
    }
  }
  pIVar2 = (pIVar7->ColorStack).Data;
  iVar10 = (pIVar7->ColorStack).Size;
  pIVar2[iVar10].Col = idx;
  pIVar8 = &pIVar2[iVar10].BackupValue;
  pIVar8->x = fVar3;
  pIVar8->y = fVar4;
  pIVar8->z = fVar5;
  pIVar8->w = fVar6;
  (pIVar7->ColorStack).Size = (pIVar7->ColorStack).Size + 1;
  if (pIVar7->DebugFlashStyleColorIdx != idx) {
    pIVar8 = (pIVar7->Style).Colors + idx;
    fVar3 = col->y;
    fVar4 = col->z;
    fVar5 = col->w;
    pIVar8->x = col->x;
    pIVar8->y = fVar3;
    pIVar8 = (pIVar7->Style).Colors + idx;
    pIVar8->z = fVar4;
    pIVar8->w = fVar5;
  }
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    if (g.DebugFlashStyleColorIdx != idx)
        g.Style.Colors[idx] = col;
}